

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_0::UniformValueMatrixCase::test(UniformValueMatrixCase *this)

{
  CallLogWrapper *this_00;
  GLuint shader;
  GLuint shader_00;
  GLuint program;
  GLint GVar1;
  float matrixValues [16];
  GLfloat local_78 [18];
  
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  shader = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  shader_00 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
  glu::CallLogWrapper::glShaderSource(this_00,shader,1,&test::testVertSource,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource(this_00,shader_00,1,&test::testFragSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,shader);
  glu::CallLogWrapper::glCompileShader(this_00,shader_00);
  ApiCase::expectError(&this->super_ApiCase,0);
  program = glu::CallLogWrapper::glCreateProgram(this_00);
  glu::CallLogWrapper::glAttachShader(this_00,program,shader);
  glu::CallLogWrapper::glAttachShader(this_00,program,shader_00);
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  glu::CallLogWrapper::glUseProgram(this_00,program);
  ApiCase::expectError(&this->super_ApiCase,0);
  local_78[0xc] = 41.0;
  local_78[0xd] = 65.0;
  local_78[0xe] = 4.0;
  local_78[0xf] = 12.2;
  local_78[8] = -55.1;
  local_78[9] = 1.1;
  local_78[10] = 98.0;
  local_78[0xb] = 19.0;
  local_78[4] = 13.0;
  local_78[5] = 55.0;
  local_78[6] = 12.0;
  local_78[7] = 91.0;
  local_78[0] = -1.0;
  local_78[1] = 0.1;
  local_78[2] = 4.0;
  local_78[3] = 800.0;
  GVar1 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"mat2Uniform");
  glu::CallLogWrapper::glUniformMatrix2fv(this_00,GVar1,1,'\0',local_78);
  verifyUniformMatrixValues<2>
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             program,GVar1,local_78,false);
  glu::CallLogWrapper::glUniformMatrix2fv(this_00,GVar1,1,'\x01',local_78);
  verifyUniformMatrixValues<2>
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             program,GVar1,local_78,true);
  GVar1 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"mat3Uniform");
  glu::CallLogWrapper::glUniformMatrix3fv(this_00,GVar1,1,'\0',local_78);
  verifyUniformMatrixValues<3>
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             program,GVar1,local_78,false);
  glu::CallLogWrapper::glUniformMatrix3fv(this_00,GVar1,1,'\x01',local_78);
  verifyUniformMatrixValues<3>
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             program,GVar1,local_78,true);
  GVar1 = glu::CallLogWrapper::glGetUniformLocation(this_00,program,"mat4Uniform");
  glu::CallLogWrapper::glUniformMatrix4fv(this_00,GVar1,1,'\0',local_78);
  verifyUniformMatrixValues<4>
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             program,GVar1,local_78,false);
  glu::CallLogWrapper::glUniformMatrix4fv(this_00,GVar1,1,'\x01',local_78);
  verifyUniformMatrixValues<4>
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             program,GVar1,local_78,true);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteShader(this_00,shader);
  glu::CallLogWrapper::glDeleteShader(this_00,shader_00);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		static const char* testVertSource =
			"#version 300 es\n"
			"uniform highp mat2 mat2Uniform;"
			"uniform highp mat3 mat3Uniform;"
			"uniform highp mat4 mat4Uniform;"
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(mat2Uniform[0][0] + mat3Uniform[0][0] + mat4Uniform[0][0]);\n"
			"}\n";
		static const char* testFragSource =
			"#version 300 es\n"
			"layout(location = 0) out mediump vec4 fragColor;"
			"void main (void)\n"
			"{\n"
			"	fragColor = vec4(0.0);\n"
			"}\n";

		GLuint shaderVert = glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag = glCreateShader(GL_FRAGMENT_SHADER);

		glShaderSource(shaderVert, 1, &testVertSource, DE_NULL);
		glShaderSource(shaderFrag, 1, &testFragSource, DE_NULL);

		glCompileShader(shaderVert);
		glCompileShader(shaderFrag);
		expectError(GL_NO_ERROR);

		GLuint program = glCreateProgram();
		glAttachShader(program, shaderVert);
		glAttachShader(program, shaderFrag);
		glLinkProgram(program);
		glUseProgram(program);
		expectError(GL_NO_ERROR);

		GLint location;

		float matrixValues[4 * 4] =
		{
			-1.0f,	0.1f,	4.0f,	800.0f,
			13.0f,	55.0f,	12.0f,	91.0f,
			-55.1f,	1.1f,	98.0f,	19.0f,
			41.0f,	65.0f,	4.0f,	12.2f,
		};

		// the values of the matrix are returned in column major order but they can be given in either order

		location = glGetUniformLocation(program,"mat2Uniform");
		glUniformMatrix2fv(location, 1, GL_FALSE, matrixValues);
		verifyUniformMatrixValues<2>(m_testCtx, *this, program, location, matrixValues, false);
		glUniformMatrix2fv(location, 1, GL_TRUE, matrixValues);
		verifyUniformMatrixValues<2>(m_testCtx, *this, program, location, matrixValues, true);

		location = glGetUniformLocation(program,"mat3Uniform");
		glUniformMatrix3fv(location, 1, GL_FALSE, matrixValues);
		verifyUniformMatrixValues<3>(m_testCtx, *this, program, location, matrixValues, false);
		glUniformMatrix3fv(location, 1, GL_TRUE, matrixValues);
		verifyUniformMatrixValues<3>(m_testCtx, *this, program, location, matrixValues, true);

		location = glGetUniformLocation(program,"mat4Uniform");
		glUniformMatrix4fv(location, 1, GL_FALSE, matrixValues);
		verifyUniformMatrixValues<4>(m_testCtx, *this, program, location, matrixValues, false);
		glUniformMatrix4fv(location, 1, GL_TRUE, matrixValues);
		verifyUniformMatrixValues<4>(m_testCtx, *this, program, location, matrixValues, true);

		glUseProgram(0);
		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(program);
		expectError(GL_NO_ERROR);
	}